

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vs_wrapper.hpp
# Opt level: O1

void __thiscall
VSInterface::VSInDelegator::Read
          (VSInDelegator *this,char *name,vector<float,_std::allocator<float>_> *output)

{
  iterator __position;
  int iVar1;
  undefined8 in_RAX;
  int iVar2;
  double dVar3;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  iVar1 = (*this->_vsapi->propNumElements)(this->_in,name);
  if (-1 < iVar1) {
    if (*(long *)(output + 8) != *(long *)output) {
      *(long *)(output + 8) = *(long *)output;
    }
    if (iVar1 != 0) {
      iVar2 = 1;
      if (1 < iVar1) {
        iVar2 = iVar1;
      }
      iVar1 = 0;
      do {
        dVar3 = (*this->_vsapi->propGetFloat)(this->_in,name,iVar1,&this->_err);
        uStack_38 = CONCAT44((float)dVar3,(undefined4)uStack_38);
        __position._M_current = *(float **)(output + 8);
        if (__position._M_current == *(float **)(output + 0x10)) {
          std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                    (output,__position,(float *)((long)&uStack_38 + 4));
        }
        else {
          *__position._M_current = (float)dVar3;
          *(float **)(output + 8) = __position._M_current + 1;
        }
        iVar1 = iVar1 + 1;
      } while (iVar2 != iVar1);
    }
  }
  return;
}

Assistant:

void Read(const char* name, std::vector<float>& output) override {
      auto size = _vsapi->propNumElements(_in, name);
      if (size < 0) return;
      output.clear();
      for (int i = 0; i < size; i++)
        output.push_back(static_cast<float>(_vsapi->propGetFloat(_in, name, i, &_err)));
    }